

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroid_test.cpp
# Opt level: O3

void __thiscall DECOMPOSE_Benchmark5times1e4_Test::TestBody(DECOMPOSE_Benchmark5times1e4_Test *this)

{
  pointer *this_00;
  pointer *this_01;
  bool bVar1;
  int mode;
  char *message;
  undefined1 local_b0 [8];
  Graph G;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> calcdegs;
  vector<int,_std::allocator<int>_> degs;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  mode = 0;
  this_01 = &G.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    gen_tree((Graph *)local_b0,10000,mode);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)this_01,(Graph *)local_b0);
    deg((vector<int,_std::allocator<int>_> *)
        &calcdegs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage,(Graph *)this_01);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)this_01);
    example_decompose((vector<int,_std::allocator<int>_> *)local_80,(Graph *)local_b0);
    testing::internal::
    CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              (local_48,"degs","calcdegs",
               (vector<int,_std::allocator<int>_> *)
               &calcdegs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<int,_std::allocator<int>_> *)local_80);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      message = "";
      if (gtest_ar._0_8_ != 0) {
        message = *(char **)gtest_ar._0_8_;
      }
      this_00 = &degs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/centroid_test.cpp"
                 ,0x98,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_80 != (undefined1  [8])0x0) {
      operator_delete((void *)local_80);
    }
    if (calcdegs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      operator_delete(calcdegs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((Graph *)local_b0);
    mode = mode + 1;
  } while (mode != 5);
  return;
}

Assistant:

TEST(DECOMPOSE, Benchmark5times1e4) {
	int runs = 5, size = 10000;
	rep(i, 0, runs) {
		Graph G = gen_tree(size, i);
		vector<int> degs = deg(G);
		vector<int> calcdegs = example_decompose(G);
		EXPECT_EQ(degs, calcdegs);
	}
}